

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_sort(kvtree *hash,int direction)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct *pkVar2;
  long lVar3;
  long lVar4;
  code *__compar;
  size_t __nmemb;
  uint uVar5;
  sort_elem_str *list;
  void *local_28;
  
  if ((hash == (kvtree *)0x0) || (pkVar2 = hash->lh_first, pkVar2 == (kvtree_elem_struct *)0x0)) {
    __nmemb = 0;
  }
  else {
    __nmemb = 0;
    do {
      pkVar2 = (pkVar2->pointers).le_next;
      __nmemb = __nmemb + 1;
    } while (pkVar2 != (kvtree_elem_struct *)0x0);
  }
  local_28 = kvtree_malloc(__nmemb << 4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                           ,0x23e);
  uVar5 = 0;
  if (hash == (kvtree *)0x0) {
    pkVar2 = (kvtree_elem_struct *)0x0;
  }
  else {
    pkVar2 = hash->lh_first;
  }
  if (pkVar2 != (kvtree_elem_struct *)0x0) {
    uVar5 = 0;
    lVar4 = 0;
    do {
      *(char **)((long)local_28 + lVar4) = pkVar2->key;
      *(kvtree_elem_struct **)((long)local_28 + lVar4 + 8) = pkVar2;
      pkVar2 = (pkVar2->pointers).le_next;
      lVar4 = lVar4 + 0x10;
      uVar5 = uVar5 + 1;
    } while (pkVar2 != (kvtree_elem_struct *)0x0);
  }
  __compar = kvtree_cmp_fn_str_asc;
  if (direction == 1) {
    __compar = kvtree_cmp_fn_str_desc;
  }
  qsort(local_28,__nmemb,0x10,__compar);
  if (0 < (int)uVar5) {
    lVar4 = (ulong)uVar5 + 1;
    lVar3 = (ulong)uVar5 * 0x10 + -8;
    do {
      pkVar2 = *(kvtree_elem_struct **)((long)local_28 + lVar3);
      pkVar1 = (pkVar2->pointers).le_next;
      if (pkVar1 != (kvtree_elem_struct *)0x0) {
        (pkVar1->pointers).le_prev = (pkVar2->pointers).le_prev;
      }
      *(pkVar2->pointers).le_prev = pkVar1;
      pkVar1 = hash->lh_first;
      (pkVar2->pointers).le_next = pkVar1;
      if (pkVar1 != (kvtree_elem_struct *)0x0) {
        (pkVar1->pointers).le_prev = &(pkVar2->pointers).le_next;
      }
      hash->lh_first = pkVar2;
      (pkVar2->pointers).le_prev = &hash->lh_first;
      lVar4 = lVar4 + -1;
      lVar3 = lVar3 + -0x10;
    } while (1 < lVar4);
  }
  kvtree_free(&local_28);
  return 0;
}

Assistant:

int kvtree_sort(kvtree* hash, int direction)
{
  /* get the size of the hash */
  int count = kvtree_size(hash);

  /* allocate space for each element */
  struct sort_elem_str* list = (struct sort_elem_str*) KVTREE_MALLOC(count * sizeof(struct sort_elem_str));

  /* walk the hash and fill in the keys */
  kvtree_elem* elem = NULL;
  int index = 0;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    char* key = kvtree_elem_key(elem);
    list[index].key = key;
    list[index].addr = elem;
    index++;
  }

  /* sort the elements by key */
  int (*fn)(const void* a, const void* b) = NULL;
  fn = &kvtree_cmp_fn_str_asc;
  if (direction == KVTREE_SORT_DESCENDING) {
    fn = &kvtree_cmp_fn_str_desc;
  }
  qsort(list, count, sizeof(struct sort_elem_str), fn);

  /* walk the sorted list backwards, extracting the element by address,
   * and inserting at the head */
  while (index > 0) {
    index--;
    elem = list[index].addr;
    LIST_REMOVE(elem, pointers);
    LIST_INSERT_HEAD(hash, elem, pointers);
  }

  /* free the list */
  kvtree_free(&list);

  return KVTREE_SUCCESS;
}